

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::update
          (CRotationZ<std::complex<double>_> *this,rotation_type *rot)

{
  QRotationGate1<std::complex<double>_> *this_00;
  rotation_type *rot_local;
  CRotationZ<std::complex<double>_> *this_local;
  
  this_00 = &std::
             unique_ptr<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
             ::operator->(&this->gate_)->super_QRotationGate1<std::complex<double>_>;
  QRotationGate1<std::complex<double>_>::update(this_00,rot);
  return;
}

Assistant:

void update( const rotation_type& rot ) { gate_->update( rot ) ; }